

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkSopToCubes(Abc_Ntk_t *pNtk,int fXor)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pNodeOld;
  int local_3c;
  int i;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtkNew;
  int fXor_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsSopLogic(pNtk);
  if (iVar1 != 0) {
    Abc_NtkCleanCopy(pNtk);
    pNtk_local = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
    p = Abc_NtkDfs(pNtk,0);
    for (local_3c = 0; iVar1 = Vec_PtrSize(p), local_3c < iVar1; local_3c = local_3c + 1) {
      pNodeOld = (Abc_Obj_t *)Vec_PtrEntry(p,local_3c);
      Abc_NodeSopToCubes(pNodeOld,pNtk_local,fXor);
    }
    Vec_PtrFree(p);
    Abc_NtkFinalize(pNtk,pNtk_local);
    iVar1 = Abc_NtkCheck(pNtk_local);
    if (iVar1 == 0) {
      printf("Abc_NtkSopToCubes: The network check has failed.\n");
      Abc_NtkDelete(pNtk_local);
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    return pNtk_local;
  }
  __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                ,0xa21,"Abc_Ntk_t *Abc_NtkSopToCubes(Abc_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkSopToCubes( Abc_Ntk_t * pNtk, int fXor )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pNode;
    Vec_Ptr_t * vNodes;
    int i;
    assert( Abc_NtkIsSopLogic(pNtk) );
    Abc_NtkCleanCopy( pNtk );
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // perform conversion in the topological order
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        Abc_NodeSopToCubes( pNode, pNtkNew, fXor );
    Vec_PtrFree( vNodes );
    // make sure everything is okay
    Abc_NtkFinalize( pNtk, pNtkNew );
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkSopToCubes: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}